

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O0

TX_MODE select_tx_mode(AV1_COMMON *cm,TX_SIZE_SEARCH_METHOD tx_size_search_method)

{
  TX_SIZE_SEARCH_METHOD tx_size_search_method_local;
  AV1_COMMON *cm_local;
  TX_MODE local_1;
  
  if (((cm->features).coded_lossless & 1U) == 0) {
    if (tx_size_search_method == '\x02') {
      local_1 = '\x01';
    }
    else {
      local_1 = '\x02';
    }
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

static TX_MODE select_tx_mode(
    const AV1_COMMON *cm, const TX_SIZE_SEARCH_METHOD tx_size_search_method) {
  if (cm->features.coded_lossless) return ONLY_4X4;
  if (tx_size_search_method == USE_LARGESTALL) {
    return TX_MODE_LARGEST;
  } else {
    assert(tx_size_search_method == USE_FULL_RD ||
           tx_size_search_method == USE_FAST_RD);
    return TX_MODE_SELECT;
  }
}